

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

void __thiscall iqnet::ssl::Ctx::prepare_verify(Ctx *this,SSL *ssl,bool server)

{
  type pIVar1;
  undefined7 in_register_00000011;
  uint mode;
  ConnectionVerifier *data;
  
  pIVar1 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
  if ((int)CONCAT71(in_register_00000011,server) == 0) {
    data = pIVar1->server_verifier;
    if (data != (ConnectionVerifier *)0x0) {
      mode = 1;
      goto LAB_0017848d;
    }
    mode = 0;
  }
  else {
    data = pIVar1->client_verifier;
    pIVar1 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
    mode = (data != (ConnectionVerifier *)0x0) + 2;
    if (pIVar1->require_client_cert == false) {
      mode = (uint)(data != (ConnectionVerifier *)0x0);
    }
    if (data != (ConnectionVerifier *)0x0) {
LAB_0017848d:
      SSL_set_verify((SSL *)ssl,mode,anon_unknown_9::iqxmlrpc_SSL_verify);
      SSL_set_ex_data((SSL *)ssl,iqxmlrpc_ssl_data_idx,data);
      return;
    }
  }
  SSL_set_verify((SSL *)ssl,mode,(callback *)0x0);
  return;
}

Assistant:

void
Ctx::prepare_verify(SSL* ssl, bool server)
{
  ConnectionVerifier* v = server ? impl_->client_verifier : impl_->server_verifier;
  int mode = v ? SSL_VERIFY_PEER : SSL_VERIFY_NONE;

  if (server && impl_->require_client_cert)
    mode |= SSL_VERIFY_FAIL_IF_NO_PEER_CERT;

  if (v) {
    SSL_set_verify(ssl, mode, iqxmlrpc_SSL_verify);
    SSL_set_ex_data(ssl, iqxmlrpc_ssl_data_idx, (void*)v);
  } else {
    SSL_set_verify(ssl, mode, 0);
  }
}